

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_util_assertion.hpp
# Opt level: O2

AssertionResult *
iuutil::CmpHelperSTRLNEQ
          (AssertionResult *__return_storage_ptr__,char *expr1,char *expr2,size_t len1,string *val2)

{
  AssertionResult *pAVar1;
  size_t len2;
  size_t local_58;
  size_t local_50;
  char *local_48;
  char *local_40;
  AssertionResult local_38;
  
  local_58 = val2->_M_string_length;
  if (local_58 == len1) {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_string_length = 0;
    (__return_storage_ptr__->m_message).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->m_result = true;
  }
  else {
    local_38.m_message._M_dataplus._M_p = (pointer)&local_38.m_message.field_2;
    local_38.m_message._M_string_length = 0;
    local_38.m_message.field_2._M_local_buf[0] = '\0';
    local_38.m_result = false;
    local_50 = len1;
    local_48 = expr2;
    local_40 = expr1;
    pAVar1 = iutest::AssertionResult::operator<<(&local_38,(char (*) [18])"error: Value of: ");
    pAVar1 = iutest::AssertionResult::operator<<(pAVar1,&local_40);
    pAVar1 = iutest::AssertionResult::operator<<(pAVar1,(char (*) [12])" == strlen(");
    pAVar1 = iutest::AssertionResult::operator<<(pAVar1,&local_48);
    pAVar1 = iutest::AssertionResult::operator<<(pAVar1,(char (*) [2])0x32249f);
    pAVar1 = iutest::AssertionResult::operator<<(pAVar1,(char (*) [12])0x31d64d);
    pAVar1 = iutest::AssertionResult::operator<<(pAVar1,val2);
    pAVar1 = iutest::AssertionResult::operator<<(pAVar1,(char (*) [4])0x314bef);
    pAVar1 = iutest::AssertionResult::operator<<(pAVar1,&local_58);
    pAVar1 = iutest::AssertionResult::operator<<(pAVar1,(char (*) [12])"\nExpected: ");
    pAVar1 = iutest::AssertionResult::operator<<(pAVar1,&local_50);
    iutest::AssertionResult::AssertionResult(__return_storage_ptr__,pAVar1);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

inline ::iutest::AssertionResult IUTEST_ATTRIBUTE_UNUSED_ CmpHelperSTRLNEQ(const char* expr1, const char* expr2
                                        , size_t len1, const ::std::string& val2)
{
    const size_t len2 = val2.length();
    if( len2 == len1 )
    {
        return ::iutest::AssertionSuccess();
    }
    return ::iutest::AssertionFailure() << "error: Value of: " << expr1 << " == strlen(" << expr2 << ")"
        << "\n  Actual: " << val2 << " : " << len2 << "\nExpected: " << len1;
}